

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

PartitionWriteInfo * __thiscall
duckdb::CopyToFunctionGlobalState::GetPartitionWriteInfo
          (CopyToFunctionGlobalState *this,ExecutionContext *context,PhysicalCopyToFile *op,
          vector<duckdb::Value,_true> *values)

{
  vector_of_value_map_t<unique_ptr<PartitionWriteInfo>_> *this_00;
  ClientContext *pCVar1;
  copy_to_initialize_global_t p_Var2;
  FunctionData *pFVar3;
  _Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  _Var4;
  copy_to_get_written_statistics_t p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  iterator iVar9;
  pointer pPVar10;
  type pPVar11;
  mapped_type *pmVar12;
  iterator iVar13;
  FileSystem *fs;
  type l;
  string *psVar14;
  type pFVar15;
  type pGVar16;
  CopyToFileInfo *pCVar17;
  type pCVar18;
  const_reference pvVar19;
  const_reference __args;
  const_reference this_01;
  InternalException *this_02;
  ulong __n;
  __node_base *p_Var20;
  templated_unique_single_t info;
  optional_ptr<duckdb::CopyToFileInfo,_true> written_file_info;
  idx_t local_1c8;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> global_lock;
  vector<duckdb::Value,_true> partition_keys;
  vector_of_value_map_t<unique_ptr<PartitionWriteInfo>_> *__range3;
  vector<duckdb::Value,_true> partition_values;
  undefined1 local_178 [96];
  LogicalType local_118;
  string full_path;
  LogicalType local_e0;
  string hive_path;
  vector<duckdb::Value,_true> local_a8;
  vector<duckdb::Value,_true> local_88;
  string local_70;
  string trimmed_path;
  
  StorageLock::GetExclusiveLock((StorageLock *)&global_lock);
  this_00 = &this->active_partitioned_writes;
  iVar9 = ::std::
          _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,values);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    if (this->max_open_files <= (this->active_partitioned_writes)._M_h._M_element_count) {
      p_Var20 = &(this->active_partitioned_writes)._M_h._M_before_begin;
      do {
        p_Var20 = p_Var20->_M_nxt;
        if (p_Var20 == (__node_base *)0x0) goto LAB_009dfb4e;
        pPVar10 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                  ::operator->((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                                *)(p_Var20 + 4));
      } while (pPVar10->active_writes != 0);
      pCVar1 = context->client;
      pPVar11 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                ::operator*((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                             *)(p_Var20 + 4));
      FinalizePartition(this,pCVar1,op,pPVar11);
      pmVar12 = ::std::__detail::
                _Map_base<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->previous_partitions,(key_type *)(p_Var20 + 1));
      *pmVar12 = *pmVar12 + 1;
      ::std::
      _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&this_00->_M_h,p_Var20 + 1);
    }
LAB_009dfb4e:
    iVar13 = ::std::
             _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->previous_partitions)._M_h,values);
    if (iVar13.
        super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_1c8 = 0;
    }
    else {
      local_1c8 = *(idx_t *)((long)iVar13.
                                   super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_true>
                                   ._M_cur + 0x20);
    }
    fs = FileSystem::GetFileSystem(context->client);
    PhysicalCopyToFile::GetTrimmedPath_abi_cxx11_(&trimmed_path,op,context->client);
    ::std::__cxx11::string::string((string *)&local_70,(string *)&trimmed_path);
    local_178._88_8_ = &op->partition_columns;
    local_178._80_8_ = &op->names;
    GetOrCreateDirectory
              (&hive_path,this,(vector<unsigned_long,_true> *)local_178._88_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_178._80_8_,values,&local_70,fs);
    local_178._64_8_ = this;
    local_178._72_8_ = context;
    ::std::__cxx11::string::~string((string *)&local_70);
    FilenamePattern::CreateFilename
              (&full_path,&op->filename_pattern,fs,&hive_path,&op->file_extension,local_1c8);
    if (op->overwrite_mode == COPY_APPEND) {
      while( true ) {
        iVar8 = (*fs->_vptr_FileSystem[0x12])(fs,&full_path,0);
        if ((char)iVar8 == '\0') break;
        if ((op->filename_pattern).uuid == false) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_178,
                     "CopyOverwriteMode::COPY_APPEND without {uuid} - and file exists",
                     (allocator *)&partition_keys);
          InternalException::InternalException(this_02,(string *)local_178);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        FilenamePattern::CreateFilename
                  ((string *)local_178,&op->filename_pattern,fs,&hive_path,&op->file_extension,
                   local_1c8);
        ::std::__cxx11::string::operator=((string *)&full_path,(string *)local_178);
        ::std::__cxx11::string::~string((string *)local_178);
      }
    }
    uVar7 = local_178._72_8_;
    written_file_info.ptr = (CopyToFileInfo *)0x0;
    if (op->return_type != CHANGED_ROWS) {
      l = unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
          operator*(&global_lock);
      written_file_info =
           AddFile((CopyToFunctionGlobalState *)local_178._64_8_,l,&full_path,op->return_type);
    }
    make_uniq<duckdb::PartitionWriteInfo>();
    p_Var2 = (op->function).copy_to_initialize_global;
    pFVar3 = *(FunctionData **)uVar7;
    psVar14 = (string *)
              unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator*(&op->bind_data);
    (*p_Var2)((ClientContext *)local_178,pFVar3,psVar14);
    pPVar10 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator->(&info);
    uVar6 = local_178._0_8_;
    local_178._0_8_ = (GlobalFunctionData *)0x0;
    _Var4.super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
         (pPVar10->global_state).
         super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
         .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>;
    (pPVar10->global_state).
    super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
    .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false> =
         (_Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>)uVar6;
    if (_Var4.super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl !=
        (GlobalFunctionData *)0x0) {
      (**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>.
                            _M_head_impl + 8))();
    }
    if ((GlobalFunctionData *)local_178._0_8_ != (GlobalFunctionData *)0x0) {
      (*(*(_func_int ***)local_178._0_8_)[1])();
    }
    if (written_file_info.ptr != (CopyToFileInfo *)0x0) {
      p_Var5 = (op->function).copy_to_get_written_statistics;
      pCVar1 = *(ClientContext **)uVar7;
      pFVar15 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
                operator*(&op->bind_data);
      pPVar10 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                ::operator->(&info);
      pGVar16 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                ::operator*(&pPVar10->global_state);
      pCVar17 = optional_ptr<duckdb::CopyToFileInfo,_true>::operator->(&written_file_info);
      pCVar18 = unique_ptr<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>,_true>
                ::operator*(&pCVar17->file_stats);
      (*p_Var5)(pCVar1,pFVar15,pGVar16,pCVar18);
      partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (__n = 0; __n < (ulong)((long)(op->partition_columns).
                                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(op->partition_columns).
                                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n = __n + 1) {
        pvVar19 = vector<unsigned_long,_true>::get<true>
                            ((vector<unsigned_long,_true> *)local_178._88_8_,__n);
        __args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)local_178._80_8_,*pvVar19);
        this_01 = vector<duckdb::Value,_true>::get<true>(values,__n);
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&partition_keys,__args);
        LogicalType::LogicalType(&local_118,VARCHAR);
        Value::DefaultCastAs((Value *)local_178,this_01,&local_118,false);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&partition_values,
                   (Value *)local_178);
        Value::~Value((Value *)local_178);
        LogicalType::~LogicalType(&local_118);
      }
      LogicalType::LogicalType(&local_118,VARCHAR);
      LogicalType::LogicalType(&local_e0,VARCHAR);
      local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start =
           partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish =
           partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      partition_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start =
           partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish =
           partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      partition_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::MAP((Value *)local_178,&local_118,&local_e0,&local_88,&local_a8);
      pCVar17 = optional_ptr<duckdb::CopyToFileInfo,_true>::operator->(&written_file_info);
      Value::operator=(&pCVar17->partition_keys,(Value *)local_178);
      Value::~Value((Value *)local_178);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88);
      LogicalType::~LogicalType(&local_e0);
      LogicalType::~LogicalType(&local_118);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&partition_values);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&partition_keys);
    }
    pPVar11 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator*(&info);
    pPVar10 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator->(&info);
    pPVar10->active_writes = 1;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_178,
               &values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    local_178._24_8_ =
         info.
         super_unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>
         .super__Head_base<0UL,_duckdb::PartitionWriteInfo_*,_false>._M_head_impl;
    info.
    super_unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>
    .super__Head_base<0UL,_duckdb::PartitionWriteInfo_*,_false>._M_head_impl =
         (unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>)
         (__uniq_ptr_data<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true,_true>
          )0x0;
    ::std::
    _Hashtable<duckdb::vector<duckdb::Value,true>,std::pair<duckdb::vector<duckdb::Value,true>const,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>,std::allocator<std::pair<duckdb::vector<duckdb::Value,true>const,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>>,std::__detail::_Select1st,duckdb::VectorOfValuesEquality,duckdb::VectorOfValuesHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<duckdb::vector<duckdb::Value,true>,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>>
              ((_Hashtable<duckdb::vector<duckdb::Value,true>,std::pair<duckdb::vector<duckdb::Value,true>const,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>,std::allocator<std::pair<duckdb::vector<duckdb::Value,true>const,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>>,std::__detail::_Select1st,duckdb::VectorOfValuesEquality,duckdb::VectorOfValuesHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00);
    ::std::
    pair<duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>
    ::~pair((pair<duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>
             *)local_178);
    ::std::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
    ::~unique_ptr(&info.
                   super_unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
                 );
    ::std::__cxx11::string::~string((string *)&full_path);
    ::std::__cxx11::string::~string((string *)&hive_path);
    ::std::__cxx11::string::~string((string *)&trimmed_path);
  }
  else {
    pPVar10 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator->((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                            *)((long)iVar9.
                                     super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_true>
                                     ._M_cur + 0x20));
    pPVar10->active_writes = pPVar10->active_writes + 1;
    pPVar11 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator*((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                           *)((long)iVar9.
                                    super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_true>
                                    ._M_cur + 0x20));
  }
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr(&global_lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
             );
  return pPVar11;
}

Assistant:

PartitionWriteInfo &GetPartitionWriteInfo(ExecutionContext &context, const PhysicalCopyToFile &op,
	                                          const vector<Value> &values) {
		auto global_lock = lock.GetExclusiveLock();
		// check if we have already started writing this partition
		auto active_write_entry = active_partitioned_writes.find(values);
		if (active_write_entry != active_partitioned_writes.end()) {
			// we have - continue writing in this partition
			active_write_entry->second->active_writes++;
			return *active_write_entry->second;
		}
		// check if we need to close any writers before we can continue
		if (active_partitioned_writes.size() >= max_open_files) {
			// we need to! try to close writers
			for (auto &entry : active_partitioned_writes) {
				if (entry.second->active_writes == 0) {
					// we can evict this entry - evict the partition
					FinalizePartition(context.client, op, *entry.second);
					++previous_partitions[entry.first];
					active_partitioned_writes.erase(entry.first);
					break;
				}
			}
		}
		idx_t offset = 0;
		auto prev_offset = previous_partitions.find(values);
		if (prev_offset != previous_partitions.end()) {
			offset = prev_offset->second;
		}
		auto &fs = FileSystem::GetFileSystem(context.client);
		// Create a writer for the current file
		auto trimmed_path = op.GetTrimmedPath(context.client);
		string hive_path = GetOrCreateDirectory(op.partition_columns, op.names, values, trimmed_path, fs);
		string full_path(op.filename_pattern.CreateFilename(fs, hive_path, op.file_extension, offset));
		if (op.overwrite_mode == CopyOverwriteMode::COPY_APPEND) {
			// when appending, we first check if the file exists
			while (fs.FileExists(full_path)) {
				// file already exists - re-generate name
				if (!op.filename_pattern.HasUUID()) {
					throw InternalException("CopyOverwriteMode::COPY_APPEND without {uuid} - and file exists");
				}
				full_path = op.filename_pattern.CreateFilename(fs, hive_path, op.file_extension, offset);
			}
		}
		optional_ptr<CopyToFileInfo> written_file_info;
		if (op.return_type != CopyFunctionReturnType::CHANGED_ROWS) {
			written_file_info = AddFile(*global_lock, full_path, op.return_type);
		}
		// initialize writes
		auto info = make_uniq<PartitionWriteInfo>();
		info->global_state = op.function.copy_to_initialize_global(context.client, *op.bind_data, full_path);
		if (written_file_info) {
			// set up the file stats for the copy
			op.function.copy_to_get_written_statistics(context.client, *op.bind_data, *info->global_state,
			                                           *written_file_info->file_stats);

			// set the partition info
			vector<Value> partition_keys;
			vector<Value> partition_values;
			for (idx_t i = 0; i < op.partition_columns.size(); i++) {
				const auto &partition_col_name = op.names[op.partition_columns[i]];
				const auto &partition_value = values[i];
				partition_keys.emplace_back(partition_col_name);
				partition_values.push_back(partition_value.DefaultCastAs(LogicalType::VARCHAR));
			}
			written_file_info->partition_keys = Value::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR,
			                                               std::move(partition_keys), std::move(partition_values));
		}
		auto &result = *info;
		info->active_writes = 1;
		// store in active write map
		active_partitioned_writes.insert(make_pair(values, std::move(info)));
		return result;
	}